

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManSupportSum(Nwk_Man_t *pNtk)

{
  Nwk_Obj_t *in_RAX;
  Vec_Ptr_t *__ptr;
  uint uVar1;
  int i;
  Nwk_Obj_t *pObj;
  
  uVar1 = 0;
  pObj = in_RAX;
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCos,i);
    __ptr = Nwk_ManSupportNodes(pNtk,&pObj,1);
    uVar1 = uVar1 + __ptr->nSize;
    free(__ptr->pArray);
    free(__ptr);
  }
  printf("Total supports = %d.\n",(ulong)uVar1);
  return;
}

Assistant:

void Nwk_ManSupportSum( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vSupp;
    Nwk_Obj_t * pObj;
    int i, nTotalSupps = 0;
    Nwk_ManForEachCo( pNtk, pObj, i )
    {
        vSupp = Nwk_ManSupportNodes( pNtk, &pObj, 1 );
        nTotalSupps += Vec_PtrSize( vSupp );
        Vec_PtrFree( vSupp );
    }
    printf( "Total supports = %d.\n", nTotalSupps );
}